

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O2

void printf_block_definition(BlockDefinition *block_definition,uint alignment)

{
  size_t i;
  ulong uVar1;
  ForBlockDefinition *for_block_definition;
  BlockDefinition *pBVar2;
  
LAB_00104c70:
  switch(block_definition->block_definition_type) {
  case BlockDefinitionTypeIfBlock:
    printf_alignment(alignment);
    printf("IF");
    if (*(Expression **)(block_definition + 4) != (Expression *)0x0) {
      printf_expression(*(Expression **)(block_definition + 4),alignment);
      putchar(0x3b);
    }
    pBVar2 = block_definition + 6;
LAB_00104d33:
    printf_expression(*(Expression **)pBVar2,alignment);
    break;
  case BlockDefinitionTypeElseBlock:
    goto switchD_00104c81_caseD_2;
  case BlockDefinitionTypeIfElseGroupBlock:
    goto switchD_00104c81_caseD_3;
  case BlockDefinitionTypeForBlock:
    printf_alignment(alignment);
    printf("FOR");
    if (*(Expression **)(block_definition + 4) != (Expression *)0x0) {
      printf_expression(*(Expression **)(block_definition + 4),alignment);
      putchar(0x3b);
    }
    printf_expression(*(Expression **)(block_definition + 6),alignment);
    if (*(long *)(block_definition + 8) != 0) {
      pBVar2 = block_definition + 8;
      putchar(0x3b);
      goto LAB_00104d33;
    }
    break;
  default:
    goto switchD_00104c81_default;
  }
  putchar(10);
switchD_00104c81_caseD_2:
  printf_block(*(Block **)(block_definition + 2),alignment);
  return;
switchD_00104c81_caseD_3:
  for (uVar1 = 0; uVar1 < *(ulong *)(block_definition + 2); uVar1 = uVar1 + 1) {
    printf_block_definition
              (*(BlockDefinition **)(*(long *)(block_definition + 4) + uVar1 * 8),alignment);
  }
  block_definition = *(BlockDefinition **)(block_definition + 6);
  if (block_definition == (BlockDefinition *)0x0) {
switchD_00104c81_default:
    return;
  }
  goto LAB_00104c70;
}

Assistant:

void printf_block_definition(BlockDefinition *block_definition, unsigned int alignment) {
  switch (block_definition->block_definition_type) {
    case BlockDefinitionTypeIfElseGroupBlock: {
      IfElseGroupBlockDefinition *if_else_group_block_definition = (IfElseGroupBlockDefinition *)block_definition;

      for (size_t i = 0; i < if_else_group_block_definition->if_block_definitions_length; i++) {
        printf_block_definition((BlockDefinition *) if_else_group_block_definition->if_block_definitions[i], alignment);
      }

      if (if_else_group_block_definition->else_block_definition) {
        printf_block_definition((BlockDefinition *) if_else_group_block_definition->else_block_definition, alignment);
      }

      break;
    }

    case BlockDefinitionTypeIfBlock: {
      IfBlockDefinition *if_block_definition = (IfBlockDefinition *)block_definition;

      printf_alignment(alignment);
      printf("IF");

      if (if_block_definition->pre_expression) {
        printf_expression(if_block_definition->pre_expression, alignment);
        printf(";");
      }

      printf_expression(if_block_definition->condition, alignment);
      printf("\n");
      printf_block(if_block_definition->block, alignment);

      break;
    }

    case BlockDefinitionTypeElseBlock: {
      ElseBlockDefinition *else_block_definition = (ElseBlockDefinition *) block_definition;
      printf_block(else_block_definition->block, alignment);

      break;
    }

    case BlockDefinitionTypeForBlock: {
      ForBlockDefinition *for_block_definition = (ForBlockDefinition *)block_definition;

      printf_alignment(alignment);
      printf("FOR");

      if (for_block_definition->pre_expression) {
        printf_expression(for_block_definition->pre_expression, alignment);
        printf(";");
      }

      printf_expression(for_block_definition->condition, alignment);

      if (for_block_definition->post_expression) {
        printf(";");
        printf_expression(for_block_definition->post_expression, alignment);
      }
      printf("\n");
      printf_block(for_block_definition->block, alignment);

      break;
    }
  }
}